

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::source_location_formatter<spdlog::details::null_scoped_padder>::format
          (source_location_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,
          tm *param_2,memory_buf_t *dest)

{
  uint uVar1;
  char *__s;
  size_t sVar2;
  uint value;
  size_t sVar3;
  long lVar4;
  char *buf_ptr;
  format_decimal_result<char_*> fVar5;
  char local_40 [21];
  char acStack_2b [3];
  char *local_28;
  
  if ((msg->source).line != 0) {
    __s = (msg->source).filename;
    sVar3 = strlen(__s);
    fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,__s,__s + sVar3);
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = ':';
    uVar1 = (msg->source).line;
    value = -uVar1;
    if (0 < (int)uVar1) {
      value = uVar1;
    }
    fVar5 = fmt::v9::detail::format_decimal<char,unsigned_int>(local_40,value,0x15);
    local_28 = fVar5.begin;
    if ((int)uVar1 < 0) {
      local_28[-1] = '-';
      local_28 = local_28 + -1;
    }
    lVar4 = (long)local_40 - (long)local_28;
    if (lVar4 < -0x15) {
      fmt::v9::detail::assert_fail
                ("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                 ,0x199,"negative value");
    }
    fmt::v9::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_28,local_28 + lVar4 + 0x15);
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(tm_time.tm_hour, dest);
    }